

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void * __thiscall Memory::LargeHeapBlock::GetTrackerData(LargeHeapBlock *this,void *address)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  LargeObjectHeader *pLVar5;
  void **ppvVar6;
  
  bVar3 = Recycler::DoProfileAllocTracker();
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x928,"(Recycler::DoProfileAllocTracker())",
                       "Recycler::DoProfileAllocTracker()");
    if (!bVar3) goto LAB_0065f43e;
    *puVar4 = 0;
  }
  pLVar5 = GetHeader(this,address);
  if (pLVar5 < (LargeObjectHeader *)(this->super_HeapBlock).address) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x92a,"((char *)header >= this->address)","(char *)header >= this->address")
    ;
    if (!bVar3) goto LAB_0065f43e;
    *puVar4 = 0;
  }
  uVar1 = pLVar5->objectIndex;
  if (this->allocCount <= uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x92c,"(index < this->allocCount)","index < this->allocCount");
    if (!bVar3) goto LAB_0065f43e;
    *puVar4 = 0;
  }
  if ((LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[uVar1] != pLVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x92d,"(this->HeaderList()[index] == header)",
                       "this->HeaderList()[index] == header");
    if (!bVar3) {
LAB_0065f43e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  ppvVar6 = GetTrackerDataArray(this);
  return ppvVar6[uVar1];
}

Assistant:

void *
LargeHeapBlock::GetTrackerData(void * address)
{
    Assert(Recycler::DoProfileAllocTracker());
    LargeObjectHeader * header = GetHeader(address);
    Assert((char *)header >= this->address);
    uint index = header->objectIndex;
    Assert(index < this->allocCount);
    Assert(this->HeaderList()[index] == header);
    return this->GetTrackerDataArray()[index];
}